

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

void RegisterSignerRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  CRPCTable *in_stack_ffffffffffffff78;
  CRPCCommand *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  CRPCCommand *in_stack_ffffffffffffff98;
  CRPCCommand *pCVar2;
  CRPCCommand *local_60;
  allocator<char> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterSignerRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffff88 = (CRPCCommand *)&stack0xffffffffffffffd7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb8,(char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                 in_stack_ffffffffffffffa8);
      CRPCCommand::CRPCCommand
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (RpcMethodFnType)in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(in_stack_ffffffffffffff68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    }
  }
  pCVar2 = (CRPCCommand *)&RegisterSignerRPCCommands(CRPCTable&)::commands;
  for (local_60 = RegisterSignerRPCCommands::commands; local_60 != pCVar2; local_60 = local_60 + 1)
  {
    CRPCTable::appendCommand
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterSignerRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"signer", &enumeratesigners},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}